

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlSerializeText(xmlOutputBufferPtr buf,xmlChar *string,uint flags)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  byte *utf;
  uint uVar5;
  int len;
  char tempBuf [12];
  
  if (string == (xmlChar *)0x0) {
    return;
  }
  pcVar3 = "";
  if ((flags & 1) == 0) {
    pcVar3 = "";
  }
LAB_00168ccc:
  bVar4 = *string;
  if (bVar4 == 0) {
    return;
  }
  iVar1 = 0;
  uVar5 = 0xffffffff;
  utf = string;
  do {
    if ((char)bVar4 < '\0') {
      if ((flags & 2) != 0) break;
    }
    else {
      uVar5 = (uint)pcVar3[bVar4];
      if (-1 < (int)uVar5) break;
    }
    bVar4 = utf[1];
    utf = utf + 1;
    iVar1 = iVar1 + 1;
  } while( true );
  if (string < utf) {
    xmlOutputBufferWrite(buf,iVar1,(char *)string);
  }
  if (-1 < (int)uVar5) {
    if (bVar4 == 0) {
      return;
    }
    xmlOutputBufferWrite
              (buf,(int)"\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;"
                        [uVar5],
               "\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;" +
               (ulong)uVar5 + 1);
    string = utf + 1;
    goto LAB_00168ccc;
  }
  len = 4;
  uVar5 = xmlGetUTF8Char(utf,&len);
  if ((int)uVar5 < 0) {
    uVar5 = 0xfffd;
    lVar2 = 1;
    goto LAB_00168dc4;
  }
  if (uVar5 < 0x100) {
    if (uVar5 < 0x20) {
      if (4 < uVar5 - 9) goto LAB_00168dba;
      uVar5 = *(uint *)(&DAT_001cb844 + (ulong)(uVar5 - 9) * 4);
    }
  }
  else if (0xfffff < uVar5 - 0x10000 && (0x1ffd < uVar5 - 0xe000 && 0xd7ff < uVar5)) {
LAB_00168dba:
    uVar5 = 0xfffd;
  }
  lVar2 = (long)len;
LAB_00168dc4:
  string = utf + lVar2;
  iVar1 = xmlSerializeHexCharRef(tempBuf,uVar5);
  xmlOutputBufferWrite(buf,iVar1,tempBuf);
  goto LAB_00168ccc;
}

Assistant:

static void
xmlSerializeText(xmlOutputBufferPtr buf, const xmlChar *string,
                 unsigned flags) {
    const char *cur;
    const signed char *tab;

    if (string == NULL)
        return;

    if (flags & XML_ESCAPE_ATTR)
        tab = xmlEscapeTabAttr;
    else
        tab = xmlEscapeTab;

    cur = (const char *) string;

    while (*cur != 0) {
        const char *base;
        int c;
        int offset;

        base = cur;
        offset = -1;

        while (1) {
            c = (unsigned char) *cur;

            if (c < 0x80) {
                offset = tab[c];
                if (offset >= 0)
                    break;
            } else if (flags & XML_ESCAPE_NON_ASCII) {
                break;
            }

            cur += 1;
        }

        if (cur > base)
            xmlOutputBufferWrite(buf, cur - base, base);

        if (offset >= 0) {
            if (c == 0)
                break;

            xmlOutputBufferWrite(buf, xmlEscapeContent[offset],
                                 &xmlEscapeContent[offset+1]);
            cur += 1;
        } else {
            char tempBuf[12];
            int tempSize;
            int val = 0, len = 4;

            val = xmlGetUTF8Char((const xmlChar *) cur, &len);
            if (val < 0) {
                val = 0xFFFD;
                cur += 1;
            } else {
                if (!IS_CHAR(val))
                    val = 0xFFFD;
                cur += len;
            }

            tempSize = xmlSerializeHexCharRef(tempBuf, val);
            xmlOutputBufferWrite(buf, tempSize, tempBuf);
        }
    }
}